

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O2

void cache_free(void)

{
  free_aligned(cache_table,cache_max << 5);
  free_aligned(cache_status,cache_max << 2);
  return;
}

Assistant:

void
cache_free()
{
    free_aligned(cache_table, cache_max * sizeof(struct cache_entry));
    free_aligned(cache_status, cache_max * sizeof(uint32_t));
}